

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O2

void server::olangfilter_cmd(int cid,char **args,int argc)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  stringformatter local_130;
  string msg;
  
  bVar1 = QServ::getlastSA(&qs);
  if (!bVar1) {
    local_130.buf = msg;
    bVar1 = QServ::isLangWarnOn(&qs);
    pcVar4 = "Off";
    if (bVar1) {
      pcVar4 = "On";
    }
    stringformatter::operator()(&local_130,"%s",pcVar4);
    iVar3 = QServ::getSender(&qs);
    sendf(iVar3,1,"ris",0x23,msg);
    return;
  }
  uVar2 = atoi(args[1]);
  if (uVar2 < 2) {
    QServ::setoLang(&qs,uVar2 != 0);
    return;
  }
  iVar3 = QServ::getSender(&qs);
  pcVar4 = QServ::getCommandDesc(&qs,cid);
  sendf(iVar3,1,"ris",0x23,pcVar4);
  return;
}

Assistant:

QSERV_CALLBACK olangfilter_cmd(p) {
        if(CMD_SA) {
            int state = atoi(args[1]);

            if(state == 0 or state == 1) {
                qs.setoLang(state);
            } else {
                sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
            }
        } else {
            defformatstring(msg)("%s", (qs.isLangWarnOn() == 1) ? "On" : "Off");
            sendf(CMD_SENDER, 1, "ris", N_SERVMSG, msg);
        }
    }